

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::IntercomCommunicationParameters
          (IntercomCommunicationParameters *this,IntercomCommunicationParameters *param_1)

{
  KUINT16 KVar1;
  undefined4 uVar2;
  IntercomCommunicationParameters *param_1_local;
  IntercomCommunicationParameters *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__IntercomCommunicationParameters_004f2d60;
  KVar1 = param_1->m_ui16Length;
  uVar2 = *(undefined4 *)&param_1->field_0xc;
  this->m_ui16Type = param_1->m_ui16Type;
  this->m_ui16Length = KVar1;
  *(undefined4 *)&this->field_0xc = uVar2;
  this->m_pRecord = param_1->m_pRecord;
  this->m_bMemoryManage = param_1->m_bMemoryManage;
  return;
}

Assistant:

class KDIS_EXPORT IntercomCommunicationParameters : public DataTypeBase
{
protected:

    KUINT16 m_ui16Type;

    KUINT16 m_ui16Length;

    DataTypeBase * m_pRecord;

    KBOOL m_bMemoryManage; // If we create the pointer we should delete it

public:

    static const KUINT16 INTERCOM_COMMS_PARAM_SIZE = 4;

    IntercomCommunicationParameters();

    IntercomCommunicationParameters(KDataStream &stream) noexcept(false);

    IntercomCommunicationParameters( EntityDestinationRecord * EDR );

    IntercomCommunicationParameters( GroupDestinationRecord * GDR );

    IntercomCommunicationParameters( GroupAssignmentRecord * GAR );

    virtual ~IntercomCommunicationParameters();

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::GetRecordType
    // Description: Identifies the additional parameters type.
    //************************************
    KDIS::DATA_TYPE::ENUMS::AdditionalIntrCommParamType GetRecordType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::GetLength
    // Description: Length of the RECORD parameters, does not include size of type and
    //              length field.
    //************************************
    KUINT16 GetLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::SetRecord
    //              KDIS::DATA_TYPE::IntercomCommunicationParameters::GetRecord
    // Description: Set the record. GetRecord will return NULL if no record is stored.
    //              Use GetType to know what record type to cast the returned pointer to.
    // Parameter:   ...Record *
    //************************************
    void SetRecord( EntityDestinationRecord * EDR );
    void SetRecord( GroupDestinationRecord * GDR );
    void SetRecord( GroupAssignmentRecord * GAR );
    const DataTypeBase * GetRecord() const;
    DataTypeBase * GetRecord();

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::IntercomCommunicationParameters::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const IntercomCommunicationParameters & Value ) const;
    KBOOL operator != ( const IntercomCommunicationParameters & Value ) const;
}